

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstandardpaths.cpp
# Opt level: O1

QString * QStandardPaths::locate
                    (QString *__return_storage_ptr__,StandardLocation type,QString *fileName,
                    LocateOptions options)

{
  Data *pDVar1;
  bool bVar2;
  QString *pQVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<QString> QStack_68;
  QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_const_QString_&> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  standardLocations((QStringList *)&QStack_68,type);
  if (QStack_68.size != 0) {
    pQVar3 = QStack_68.ptr;
    do {
      (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      local_50.a.b = L'/';
      local_50.a.a = pQVar3;
      local_50.b = fileName;
      QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_const_QString_&>::convertTo<QString>
                (__return_storage_ptr__,&local_50);
      bVar2 = existsAsSpecified(__return_storage_ptr__,options);
      if (bVar2) goto LAB_002577c6;
      pDVar1 = (__return_storage_ptr__->d).d;
      if (pDVar1 != (Data *)0x0) {
        LOCK();
        (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&((__return_storage_ptr__->d).d)->super_QArrayData,2,0x10);
        }
      }
      pQVar3 = pQVar3 + 1;
    } while (pQVar3 != QStack_68.ptr + QStack_68.size);
  }
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
LAB_002577c6:
  QArrayDataPointer<QString>::~QArrayDataPointer(&QStack_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QStandardPaths::locate(StandardLocation type, const QString &fileName, LocateOptions options)
{
    const QStringList &dirs = standardLocations(type);
    for (QStringList::const_iterator dir = dirs.constBegin(); dir != dirs.constEnd(); ++dir) {
        const QString path = *dir + u'/' + fileName;
        if (existsAsSpecified(path, options))
            return path;
    }
    return QString();
}